

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SectionNode *sectionNode;
  pointer pcVar2;
  pointer pbVar3;
  size_type sVar4;
  long *plVar5;
  pointer pbVar6;
  long *plVar7;
  ulong *puVar8;
  pointer pbVar9;
  long lVar10;
  string className;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  sectionNode = (((testCaseNode->children).
                  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (testCaseNode->value).testInfo.className._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,
             pcVar2 + (testCaseNode->value).testInfo.className._M_string_length);
  if (local_90._M_string_length != 0) goto LAB_0012e963;
  pbVar9 = (testCaseNode->value).testInfo.tags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (testCaseNode->value).testInfo.tags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pbVar3 - (long)pbVar9 >> 7;
  pbVar6 = pbVar9;
  if (0 < lVar10) {
    pbVar6 = (pointer)((long)&(pbVar9->_M_dataplus)._M_p +
                      ((long)pbVar3 - (long)pbVar9 & 0xffffffffffffff80U));
    lVar10 = lVar10 + 1;
    pbVar9 = pbVar9 + 2;
    do {
      if (*pbVar9[-2]._M_dataplus._M_p == '#') {
        pbVar9 = pbVar9 + -2;
        goto LAB_0012e8e2;
      }
      if (*pbVar9[-1]._M_dataplus._M_p == '#') {
        pbVar9 = pbVar9 + -1;
        goto LAB_0012e8e2;
      }
      if (*(pbVar9->_M_dataplus)._M_p == '#') goto LAB_0012e8e2;
      if (*pbVar9[1]._M_dataplus._M_p == '#') {
        pbVar9 = pbVar9 + 1;
        goto LAB_0012e8e2;
      }
      lVar10 = lVar10 + -1;
      pbVar9 = pbVar9 + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)pbVar3 - (long)pbVar6 >> 5;
  if (lVar10 == 1) {
LAB_0012e8c3:
    pbVar9 = pbVar6;
    if (*(pbVar6->_M_dataplus)._M_p != '#') {
      pbVar9 = pbVar3;
    }
  }
  else if (lVar10 == 2) {
LAB_0012e8b7:
    pbVar9 = pbVar6;
    if (*(pbVar6->_M_dataplus)._M_p != '#') {
      pbVar6 = pbVar6 + 1;
      goto LAB_0012e8c3;
    }
  }
  else {
    pbVar9 = pbVar3;
    if ((lVar10 == 3) && (pbVar9 = pbVar6, *(pbVar6->_M_dataplus)._M_p != '#')) {
      pbVar6 = pbVar6 + 1;
      goto LAB_0012e8b7;
    }
  }
LAB_0012e8e2:
  if (pbVar9 == pbVar3) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_allocated_capacity =
         local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)pbVar9);
  }
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1618fa);
  }
LAB_0012e963:
  (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_NonCopyable)._vptr_NonCopyable[4])(&local_b0);
  sVar4 = local_b0._M_string_length;
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (sVar4 != 0) {
    (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[4])(local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    puVar8 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_b0.field_2._M_allocated_capacity = *puVar8;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar8;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  writeSection(this,&local_90,&local_b0,sectionNode,
               ((testCaseNode->value).testInfo.properties & (MayFail|ShouldFail)) != None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JunitReporter::writeTestCase( TestCaseNode const& testCaseNode ) {
        TestCaseStats const& stats = testCaseNode.value;

        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert( testCaseNode.children.size() == 1 );
        SectionNode const& rootSection = *testCaseNode.children.front();

        std::string className = stats.testInfo.className;

        if( className.empty() ) {
            className = fileNameTag(stats.testInfo.tags);
            if ( className.empty() )
                className = "global";
        }

        if ( !m_config->name().empty() )
            className = m_config->name() + "." + className;

        writeSection( className, "", rootSection, stats.testInfo.okToFail() );
    }